

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,cmBuildOptions *buildOptions,bool verbose,string *presetName,
            bool listPresets)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  string *psVar5;
  pointer ppVar6;
  BuildPreset *pBVar7;
  pointer ppVar8;
  ConfigurePreset *pCVar9;
  uint *puVar10;
  PackageResolveMode *pPVar11;
  bool *pbVar12;
  const_iterator __first;
  const_iterator __last;
  ostream *poVar13;
  pointer pcVar14;
  cmGlobalGenerator *pcVar15;
  pointer pcVar16;
  type pcVar17;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  allocator<char> local_2171;
  string local_2170;
  allocator<char> local_2149;
  string local_2148;
  allocator<char> local_2121;
  string local_2120;
  string *local_2100;
  allocator<char> local_20f1;
  string local_20f0;
  cmValue local_20d0;
  cmValue cachedProjectName;
  string projName;
  string output;
  undefined1 local_2070 [8];
  cmMakefile mf_2;
  string local_1870;
  cmValue local_1850;
  cmValue cachedGeneratorToolset;
  undefined1 local_1830 [8];
  cmMakefile mf_1;
  string local_1030;
  cmValue local_1010;
  cmValue cachedGeneratorPlatform;
  undefined1 local_ff0 [8];
  cmMakefile mf;
  string local_7f0;
  cmValue local_7d0;
  cmValue cachedGeneratorInstance;
  undefined1 local_7c0 [8];
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  string local_7b0;
  cmValue local_790;
  cmValue cachedGenerator;
  string cachePath;
  undefined1 local_750 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_738;
  undefined1 local_730 [16];
  const_iterator local_720;
  cmAlphaNum local_718;
  cmAlphaNum local_6e8;
  string local_6b8;
  optional<cmCMakePresetsGraph::ConfigurePreset> *local_698;
  optional<cmCMakePresetsGraph::ConfigurePreset> *expandedConfigurePreset;
  cmAlphaNum local_688;
  cmAlphaNum local_658;
  string local_628;
  char local_601;
  cmAlphaNum local_600;
  cmAlphaNum local_5d0;
  string local_5a0;
  _Self local_580;
  _Self local_578;
  iterator configurePresetPair;
  cmAlphaNum local_568;
  cmAlphaNum local_538;
  string local_508;
  cmAlphaNum local_4e8;
  cmAlphaNum local_4b8;
  string local_488;
  optional<cmCMakePresetsGraph::BuildPreset> *local_468;
  optional<cmCMakePresetsGraph::BuildPreset> *expandedPreset;
  cmAlphaNum local_458;
  cmAlphaNum local_428;
  string local_3f8;
  char local_3d1;
  cmAlphaNum local_3d0;
  cmAlphaNum local_3a0;
  string local_370;
  undefined1 local_350 [16];
  iterator presetPair;
  char *local_338;
  cmAlphaNum local_330;
  cmAlphaNum local_300;
  string local_2d0;
  ReadFileResult local_2ac;
  undefined1 local_2a8 [4];
  ReadFileResult result;
  cmCMakePresetsGraph settingsFile;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  byte local_42;
  byte local_41;
  bool listPresets_local;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_40;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *nativeOptions_local;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *targets_local;
  string *dir_local;
  cmake *pcStack_18;
  int jobs_local;
  cmake *this_local;
  
  local_41 = verbose;
  local_42 = listPresets;
  pcStack_40 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)nativeOptions;
  nativeOptions_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)config;
  config_local = (string *)targets;
  targets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)dir;
  dir_local._4_4_ = jobs;
  pcStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  SetHomeDirectory(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  SetHomeOutputDirectory(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  uVar4 = std::__cxx11::string::empty();
  if (((uVar4 & 1) == 0) || ((local_42 & 1) != 0)) {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeDirectory(this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeOutputDirectory
              (this,(string *)
                    &settingsFile.Files.
                     super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &settingsFile.Files.
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmCMakePresetsGraph::cmCMakePresetsGraph((cmCMakePresetsGraph *)local_2a8);
    psVar5 = GetHomeDirectory_abi_cxx11_(this);
    local_2ac = cmCMakePresetsGraph::ReadProjectPresets
                          ((cmCMakePresetsGraph *)local_2a8,psVar5,false);
    if (local_2ac == READ_OK) {
      if ((local_42 & 1) == 0) {
        local_350._8_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                     *)&settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count,presetName);
        local_350._0_8_ =
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                    *)&settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count);
        bVar2 = std::operator==((_Self *)(local_350 + 8),(_Self *)local_350);
        if (bVar2) {
          cmAlphaNum::cmAlphaNum(&local_3a0,"No such build preset in ");
          psVar5 = GetHomeDirectory_abi_cxx11_(this);
          cmAlphaNum::cmAlphaNum(&local_3d0,psVar5);
          local_3d1 = '\"';
          cmStrCat<char[4],std::__cxx11::string,char>
                    (&local_370,&local_3a0,&local_3d0,(char (*) [4])0xbf3062,presetName,&local_3d1);
          cmSystemTools::Error(&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)local_2a8,(PrintPrecedingNewline *)0x0);
          this_local._4_4_ = 1;
          presetPair._M_node._4_4_ = 1;
        }
        else {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
                                 *)(local_350 + 8));
          if (((ppVar6->second).Unexpanded.super_Preset.Hidden & 1U) == 0) {
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>
                                   *)(local_350 + 8));
            local_468 = &(ppVar6->second).Expanded;
            bVar2 = std::optional::operator_cast_to_bool((optional *)local_468);
            if (bVar2) {
              pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->(local_468);
              if (((pBVar7->super_Preset).ConditionResult & 1U) == 0) {
                cmAlphaNum::cmAlphaNum(&local_538,"Cannot use disabled build preset in ");
                psVar5 = GetHomeDirectory_abi_cxx11_(this);
                cmAlphaNum::cmAlphaNum(&local_568,psVar5);
                configurePresetPair._M_node._7_1_ = 0x22;
                cmStrCat<char[4],std::__cxx11::string,char>
                          (&local_508,&local_538,&local_568,(char (*) [4])0xbf3062,presetName,
                           (char *)((long)&configurePresetPair._M_node + 7));
                cmSystemTools::Error(&local_508);
                std::__cxx11::string::~string((string *)&local_508);
                cmCMakePresetsGraph::PrintBuildPresetList
                          ((cmCMakePresetsGraph *)local_2a8,(PrintPrecedingNewline *)0x0);
                this_local._4_4_ = 1;
                presetPair._M_node._4_4_ = 1;
              }
              else {
                pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->(local_468);
                local_578._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                             *)((long)&settingsFile.errors.field_2 + 8),&pBVar7->ConfigurePreset);
                local_580._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                            *)((long)&settingsFile.errors.field_2 + 8));
                bVar2 = std::operator==(&local_578,&local_580);
                if (bVar2) {
                  cmAlphaNum::cmAlphaNum(&local_5d0,"No such configure preset in ");
                  psVar5 = GetHomeDirectory_abi_cxx11_(this);
                  cmAlphaNum::cmAlphaNum(&local_600,psVar5);
                  pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->(local_468);
                  local_601 = '\"';
                  cmStrCat<char[4],std::__cxx11::string,char>
                            (&local_5a0,&local_5d0,&local_600,(char (*) [4])0xbf3062,
                             &pBVar7->ConfigurePreset,&local_601);
                  cmSystemTools::Error(&local_5a0);
                  std::__cxx11::string::~string((string *)&local_5a0);
                  PrintPresetList(this,(cmCMakePresetsGraph *)local_2a8);
                  this_local._4_4_ = 1;
                  presetPair._M_node._4_4_ = 1;
                }
                else {
                  ppVar8 = std::
                           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                           ::operator->(&local_578);
                  if (((ppVar8->second).Unexpanded.super_Preset.Hidden & 1U) == 0) {
                    ppVar8 = std::
                             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
                             ::operator->(&local_578);
                    local_698 = &(ppVar8->second).Expanded;
                    bVar2 = std::optional::operator_cast_to_bool((optional *)local_698);
                    if (bVar2) {
                      std::optional<cmCMakePresetsGraph::ConfigurePreset>::operator->(local_698);
                      uVar4 = std::__cxx11::string::empty();
                      if ((uVar4 & 1) == 0) {
                        pCVar9 = std::optional<cmCMakePresetsGraph::ConfigurePreset>::operator->
                                           (local_698);
                        std::__cxx11::string::operator=((string *)dir,(string *)&pCVar9->BinaryDir);
                      }
                      pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                         (local_468);
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator=(&this->UnprocessedPresetEnvironment,
                                  &(pBVar7->super_Preset).Environment);
                      ProcessPresetEnvironment(this);
                      if ((dir_local._4_4_ == 0) || (dir_local._4_4_ == 0xffffffff)) {
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        bVar2 = std::optional::operator_cast_to_bool((optional *)&pBVar7->Jobs);
                        if (bVar2) {
                          pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                             (local_468);
                          puVar10 = (uint *)std::optional<int>::operator*(&pBVar7->Jobs);
                          dir_local._4_4_ = *puVar10;
                        }
                      }
                      bVar2 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::empty(targets);
                      if (bVar2) {
                        local_730._8_8_ =
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin(targets);
                        __gnu_cxx::
                        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ::__normal_iterator<std::__cxx11::string*>
                                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                    *)&local_720,
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)(local_730 + 8));
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        local_730._0_8_ =
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin(&pBVar7->Targets);
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        local_738 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::end(&pBVar7->Targets);
                        local_740 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)std::
                                       vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                       ::
                                       insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                                 ((
                                                  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                                  *)targets,local_720,
                                                  (
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )local_730._0_8_,
                                                  (
                                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  )local_738);
                      }
                      uVar4 = std::__cxx11::string::empty();
                      if ((uVar4 & 1) != 0) {
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        std::__cxx11::string::operator=
                                  ((string *)config,(string *)&pBVar7->Configuration);
                      }
                      if ((buildOptions->Clean & 1U) == 0) {
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        bVar2 = std::optional::operator_cast_to_bool
                                          ((optional *)&pBVar7->CleanFirst);
                        if (bVar2) {
                          pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                             (local_468);
                          pbVar12 = std::optional<bool>::operator*(&pBVar7->CleanFirst);
                          buildOptions->Clean = (bool)(*pbVar12 & 1);
                        }
                      }
                      if (buildOptions->ResolveMode == Default) {
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        bVar2 = std::optional::operator_cast_to_bool
                                          ((optional *)&pBVar7->ResolvePackageReferences);
                        if (bVar2) {
                          pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                             (local_468);
                          pPVar11 = std::optional<PackageResolveMode>::operator*
                                              (&pBVar7->ResolvePackageReferences);
                          buildOptions->ResolveMode = *pPVar11;
                        }
                      }
                      if ((local_41 & 1) == 0) {
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        bVar2 = std::optional::operator_cast_to_bool((optional *)&pBVar7->Verbose);
                        if (bVar2) {
                          pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                             (local_468);
                          pbVar12 = std::optional<bool>::operator*(&pBVar7->Verbose);
                          local_41 = *pbVar12 & 1;
                        }
                      }
                      bVar2 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::empty(nativeOptions);
                      if (bVar2) {
                        local_750._0_8_ =
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::begin(nativeOptions);
                        __gnu_cxx::
                        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ::__normal_iterator<std::__cxx11::string*>
                                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                    *)(local_750 + 8),
                                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_750);
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        __first = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::begin(&pBVar7->NativeToolOptions);
                        pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                           (local_468);
                        __last = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::end(&pBVar7->NativeToolOptions);
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)nativeOptions,(const_iterator)local_750._8_8_,
                                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )__first._M_current,
                                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    )__last._M_current);
                      }
                      presetPair._M_node._4_4_ = 0;
                    }
                    else {
                      cmAlphaNum::cmAlphaNum(&local_6e8,"Could not evaluate configure preset \"");
                      pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->
                                         (local_468);
                      cmAlphaNum::cmAlphaNum(&local_718,&pBVar7->ConfigurePreset);
                      cmStrCat<char[27]>(&local_6b8,&local_6e8,&local_718,
                                         (char (*) [27])"\": Invalid macro expansion");
                      cmSystemTools::Error(&local_6b8);
                      std::__cxx11::string::~string((string *)&local_6b8);
                      this_local._4_4_ = 1;
                      presetPair._M_node._4_4_ = 1;
                    }
                  }
                  else {
                    cmAlphaNum::cmAlphaNum(&local_658,"Cannot use hidden configure preset in ");
                    psVar5 = GetHomeDirectory_abi_cxx11_(this);
                    cmAlphaNum::cmAlphaNum(&local_688,psVar5);
                    pBVar7 = std::optional<cmCMakePresetsGraph::BuildPreset>::operator->(local_468);
                    expandedConfigurePreset._7_1_ = 0x22;
                    cmStrCat<char[4],std::__cxx11::string,char>
                              (&local_628,&local_658,&local_688,(char (*) [4])0xbf3062,
                               &pBVar7->ConfigurePreset,(char *)((long)&expandedConfigurePreset + 7)
                              );
                    cmSystemTools::Error(&local_628);
                    std::__cxx11::string::~string((string *)&local_628);
                    PrintPresetList(this,(cmCMakePresetsGraph *)local_2a8);
                    this_local._4_4_ = 1;
                    presetPair._M_node._4_4_ = 1;
                  }
                }
              }
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_4b8,"Could not evaluate build preset \"");
              cmAlphaNum::cmAlphaNum(&local_4e8,presetName);
              cmStrCat<char[27]>(&local_488,&local_4b8,&local_4e8,
                                 (char (*) [27])"\": Invalid macro expansion");
              cmSystemTools::Error(&local_488);
              std::__cxx11::string::~string((string *)&local_488);
              cmCMakePresetsGraph::PrintBuildPresetList
                        ((cmCMakePresetsGraph *)local_2a8,(PrintPrecedingNewline *)0x0);
              this_local._4_4_ = 1;
              presetPair._M_node._4_4_ = 1;
            }
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_428,"Cannot use hidden build preset in ");
            psVar5 = GetHomeDirectory_abi_cxx11_(this);
            cmAlphaNum::cmAlphaNum(&local_458,psVar5);
            expandedPreset._7_1_ = 0x22;
            cmStrCat<char[4],std::__cxx11::string,char>
                      (&local_3f8,&local_428,&local_458,(char (*) [4])0xbf3062,presetName,
                       (char *)((long)&expandedPreset + 7));
            cmSystemTools::Error(&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            cmCMakePresetsGraph::PrintBuildPresetList
                      ((cmCMakePresetsGraph *)local_2a8,(PrintPrecedingNewline *)0x0);
            this_local._4_4_ = 1;
            presetPair._M_node._4_4_ = 1;
          }
        }
      }
      else {
        cmCMakePresetsGraph::PrintBuildPresetList
                  ((cmCMakePresetsGraph *)local_2a8,(PrintPrecedingNewline *)0x0);
        this_local._4_4_ = 0;
        presetPair._M_node._4_4_ = 1;
      }
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_300,"Could not read presets from ");
      psVar5 = GetHomeDirectory_abi_cxx11_(this);
      cmAlphaNum::cmAlphaNum(&local_330,psVar5);
      local_338 = cmCMakePresetsGraph::ResultToString(local_2ac);
      cmStrCat<char[3],char_const*>
                (&local_2d0,&local_300,&local_330,(char (*) [3])0xbdd75a,&local_338);
      cmSystemTools::Error(&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      this_local._4_4_ = 1;
      presetPair._M_node._4_4_ = 1;
    }
    cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)local_2a8);
    if (presetPair._M_node._4_4_ != 0) {
      return this_local._4_4_;
    }
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar2) {
    poVar13 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar13 = std::operator<<(poVar13,(string *)dir);
    std::operator<<(poVar13," is not a directory\n");
    return 1;
  }
  FindCacheFile((string *)&cachedGenerator,dir);
  bVar2 = LoadCache(this,(string *)&cachedGenerator);
  if (!bVar2) {
    std::operator<<((ostream *)&std::cerr,"Error: could not load cache\n");
    this_local._4_4_ = 1;
    presetPair._M_node._4_4_ = 1;
    goto LAB_001d983e;
  }
  pcVar14 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"CMAKE_GENERATOR",
             (allocator<char> *)
             ((long)&gen._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
  local_790 = cmState::GetCacheEntryValue(pcVar14,&local_7b0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gen._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 7));
  bVar2 = cmValue::operator_cast_to_bool(&local_790);
  if (!bVar2) {
    std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n");
    this_local._4_4_ = 1;
    presetPair._M_node._4_4_ = 1;
    goto LAB_001d983e;
  }
  psVar5 = cmValue::operator*[abi_cxx11_(&local_790);
  CreateGlobalGenerator((cmake *)local_7c0,(string *)this,SUB81(psVar5,0));
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_7c0);
  if (bVar2) {
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::unique_ptr
              ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
               &cachedGeneratorInstance,
               (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)local_7c0);
    SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             *)&cachedGeneratorInstance);
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
              ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
               &cachedGeneratorInstance);
    pcVar14 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,"CMAKE_GENERATOR_INSTANCE",
               (allocator<char> *)((long)&mf.CurrentImportedTargetScope + 3));
    local_7d0 = cmState::GetCacheEntryValue(pcVar14,&local_7f0);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mf.CurrentImportedTargetScope + 3));
    bVar2 = cmValue::operator_cast_to_bool(&local_7d0);
    if (bVar2) {
      pcVar15 = GetGlobalGenerator(this);
      GetCurrentSnapshot((cmStateSnapshot *)&cachedGeneratorPlatform,this);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_ff0,pcVar15,(cmStateSnapshot *)&cachedGeneratorPlatform);
      pcVar16 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                operator->(&this->GlobalGenerator);
      psVar5 = cmValue::operator*[abi_cxx11_(&local_7d0);
      uVar3 = (*pcVar16->_vptr_cmGlobalGenerator[8])(pcVar16,psVar5,local_ff0);
      presetPair._M_node._4_1_ = (uVar3 & 1) == 0;
      if (presetPair._M_node._4_1_) {
        this_local._4_4_ = 1;
      }
      presetPair._M_node._5_3_ = 0;
      cmMakefile::~cmMakefile((cmMakefile *)local_ff0);
      if (presetPair._M_node._4_4_ != 0) goto LAB_001d9822;
    }
    pcVar14 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1030,"CMAKE_GENERATOR_PLATFORM",
               (allocator<char> *)((long)&mf_1.CurrentImportedTargetScope + 3));
    local_1010 = cmState::GetCacheEntryValue(pcVar14,&local_1030);
    std::__cxx11::string::~string((string *)&local_1030);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&mf_1.CurrentImportedTargetScope + 3));
    bVar2 = cmValue::operator_cast_to_bool(&local_1010);
    if (bVar2) {
      pcVar15 = GetGlobalGenerator(this);
      GetCurrentSnapshot((cmStateSnapshot *)&cachedGeneratorToolset,this);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_1830,pcVar15,(cmStateSnapshot *)&cachedGeneratorToolset);
      pcVar16 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                operator->(&this->GlobalGenerator);
      psVar5 = cmValue::operator*[abi_cxx11_(&local_1010);
      uVar3 = (*pcVar16->_vptr_cmGlobalGenerator[9])(pcVar16,psVar5,local_1830);
      presetPair._M_node._4_1_ = (uVar3 & 1) == 0;
      if (presetPair._M_node._4_1_) {
        this_local._4_4_ = 1;
      }
      presetPair._M_node._5_3_ = 0;
      cmMakefile::~cmMakefile((cmMakefile *)local_1830);
      if (presetPair._M_node._4_4_ != 0) goto LAB_001d9822;
    }
    pcVar14 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1870,"CMAKE_GENERATOR_TOOLSET",
               (allocator<char> *)((long)&mf_2.CurrentImportedTargetScope + 3));
    local_1850 = cmState::GetCacheEntryValue(pcVar14,&local_1870);
    std::__cxx11::string::~string((string *)&local_1870);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&mf_2.CurrentImportedTargetScope + 3));
    bVar2 = cmValue::operator_cast_to_bool(&local_1850);
    if (bVar2) {
      pcVar15 = GetGlobalGenerator(this);
      GetCurrentSnapshot((cmStateSnapshot *)((long)&output.field_2 + 8),this);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_2070,pcVar15,(cmStateSnapshot *)((long)&output.field_2 + 8));
      pcVar16 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                operator->(&this->GlobalGenerator);
      psVar5 = cmValue::operator*[abi_cxx11_(&local_1850);
      uVar3 = (*pcVar16->_vptr_cmGlobalGenerator[10])(pcVar16,psVar5,1,local_2070);
      presetPair._M_node._4_1_ = (uVar3 & 1) == 0;
      if (presetPair._M_node._4_1_) {
        this_local._4_4_ = 1;
      }
      presetPair._M_node._5_3_ = 0;
      cmMakefile::~cmMakefile((cmMakefile *)local_2070);
      if (presetPair._M_node._4_4_ != 0) goto LAB_001d9822;
    }
    std::__cxx11::string::string((string *)(projName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&cachedProjectName);
    pcVar14 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20f0,"CMAKE_PROJECT_NAME",&local_20f1);
    local_20d0 = cmState::GetCacheEntryValue(pcVar14,&local_20f0);
    std::__cxx11::string::~string((string *)&local_20f0);
    std::allocator<char>::~allocator(&local_20f1);
    bVar2 = cmValue::operator_cast_to_bool(&local_20d0);
    if (bVar2) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_20d0);
      std::__cxx11::string::operator=((string *)&cachedProjectName,(string *)psVar5);
      pcVar14 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2120,"CMAKE_VERBOSE_MAKEFILE",&local_2121);
      local_2100 = (string *)cmState::GetCacheEntryValue(pcVar14,&local_2120);
      bVar2 = cmIsOn((cmValue)local_2100);
      std::__cxx11::string::~string((string *)&local_2120);
      std::allocator<char>::~allocator(&local_2121);
      if (bVar2) {
        local_41 = 1;
      }
      pcVar16 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                operator->(&this->GlobalGenerator);
      pcVar17 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator*(&this->State);
      uVar3 = (*pcVar16->_vptr_cmGlobalGenerator[0xb])(pcVar16,pcVar17);
      if ((uVar3 & 1) == 0) {
        this_local._4_4_ = 1;
      }
      else {
        pcVar16 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                  operator->(&this->GlobalGenerator);
        (*pcVar16->_vptr_cmGlobalGenerator[0x14])(pcVar16,&std::cerr,(ulong)dir_local._4_4_);
        pcVar16 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                  operator->(&this->GlobalGenerator);
        uVar3 = dir_local._4_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2148,"",&local_2149);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2170,"",&local_2171);
        bVar1 = local_41;
        timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        this_local._4_4_ =
             cmGlobalGenerator::Build
                       (pcVar16,uVar3,&local_2148,dir,(string *)&cachedProjectName,targets,
                        (string *)((long)&projName.field_2 + 8),&local_2170,config,buildOptions,
                        (bool)(bVar1 & 1),(cmDuration)timeout.__r,OUTPUT_PASSTHROUGH,nativeOptions);
        std::__cxx11::string::~string((string *)&local_2170);
        std::allocator<char>::~allocator(&local_2171);
        std::__cxx11::string::~string((string *)&local_2148);
        std::allocator<char>::~allocator(&local_2149);
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n");
      this_local._4_4_ = 1;
    }
    presetPair._M_node._4_4_ = 1;
    std::__cxx11::string::~string((string *)&cachedProjectName);
    std::__cxx11::string::~string((string *)(projName.field_2._M_local_buf + 8));
  }
  else {
    poVar13 = std::operator<<((ostream *)&std::cerr,"Error: could not create CMAKE_GENERATOR \"");
    psVar5 = cmValue::operator*[abi_cxx11_(&local_790);
    poVar13 = std::operator<<(poVar13,(string *)psVar5);
    std::operator<<(poVar13,"\"\n");
    this_local._4_4_ = 1;
    presetPair._M_node._4_4_ = 1;
  }
LAB_001d9822:
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)local_7c0);
LAB_001d983e:
  std::__cxx11::string::~string((string *)&cachedGenerator);
  return this_local._4_4_;
}

Assistant:

int cmake::Build(int jobs, std::string dir, std::vector<std::string> targets,
                 std::string config, std::vector<std::string> nativeOptions,
                 cmBuildOptions& buildOptions, bool verbose,
                 const std::string& presetName, bool listPresets)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");

#if !defined(CMAKE_BOOTSTRAP)
  if (!presetName.empty() || listPresets) {
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

    cmCMakePresetsGraph settingsFile;
    auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
    if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
      cmSystemTools::Error(
        cmStrCat("Could not read presets from ", this->GetHomeDirectory(),
                 ": ", cmCMakePresetsGraph::ResultToString(result)));
      return 1;
    }

    if (listPresets) {
      settingsFile.PrintBuildPresetList();
      return 0;
    }

    auto presetPair = settingsFile.BuildPresets.find(presetName);
    if (presetPair == settingsFile.BuildPresets.end()) {
      cmSystemTools::Error(cmStrCat("No such build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (presetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto const& expandedPreset = presetPair->second.Expanded;
    if (!expandedPreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate build preset \"",
                                    presetName,
                                    "\": Invalid macro expansion"));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (!expandedPreset->ConditionResult) {
      cmSystemTools::Error(cmStrCat("Cannot use disabled build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto configurePresetPair =
      settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
    if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
      cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    if (configurePresetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
    if (!expandedConfigurePreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                    expandedPreset->ConfigurePreset,
                                    "\": Invalid macro expansion"));
      return 1;
    }

    if (!expandedConfigurePreset->BinaryDir.empty()) {
      dir = expandedConfigurePreset->BinaryDir;
    }

    this->UnprocessedPresetEnvironment = expandedPreset->Environment;
    this->ProcessPresetEnvironment();

    if ((jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL ||
         jobs == cmake::NO_BUILD_PARALLEL_LEVEL) &&
        expandedPreset->Jobs) {
      jobs = *expandedPreset->Jobs;
    }

    if (targets.empty()) {
      targets.insert(targets.begin(), expandedPreset->Targets.begin(),
                     expandedPreset->Targets.end());
    }

    if (config.empty()) {
      config = expandedPreset->Configuration;
    }

    if (!buildOptions.Clean && expandedPreset->CleanFirst) {
      buildOptions.Clean = *expandedPreset->CleanFirst;
    }

    if (buildOptions.ResolveMode == PackageResolveMode::Default &&
        expandedPreset->ResolvePackageReferences) {
      buildOptions.ResolveMode = *expandedPreset->ResolvePackageReferences;
    }

    if (!verbose && expandedPreset->Verbose) {
      verbose = *expandedPreset->Verbose;
    }

    if (nativeOptions.empty()) {
      nativeOptions.insert(nativeOptions.begin(),
                           expandedPreset->NativeToolOptions.begin(),
                           expandedPreset->NativeToolOptions.end());
    }
  }
#endif

  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  cmValue cachedGenerator = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  auto gen = this->CreateGlobalGenerator(*cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \""
              << *cachedGenerator << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(std::move(gen));
  cmValue cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorInstance(*cachedGeneratorInstance,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorPlatform(*cachedGeneratorPlatform,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorToolset =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_TOOLSET");
  if (cachedGeneratorToolset) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorToolset(*cachedGeneratorToolset,
                                                    true, &mf)) {
      return 1;
    }
  }
  std::string output;
  std::string projName;
  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = *cachedProjectName;

  if (cmIsOn(this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE"))) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = cmStrCat("Build files have been written to: ",
                                     this->GetHomeOutputDirectory());
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  if (!this->GlobalGenerator->ReadCacheEntriesForBuild(*this->State)) {
    return 1;
  }

  this->GlobalGenerator->PrintBuildCommandAdvice(std::cerr, jobs);
  return this->GlobalGenerator->Build(
    jobs, "", dir, projName, targets, output, "", config, buildOptions,
    verbose, cmDuration::zero(), cmSystemTools::OUTPUT_PASSTHROUGH,
    nativeOptions);
}